

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O0

double __thiscall Measurement::NIS(Measurement *this,VectorXd *z_pred,MatrixXd *S)

{
  double dVar1;
  Scalar SVar2;
  MatrixTypeNested local_a0 [3];
  Nested local_88;
  Type local_80;
  MatrixBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,4>>
  local_50 [8];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_48;
  undefined1 local_30 [8];
  VectorXd z_diff;
  MatrixXd *S_local;
  VectorXd *z_pred_local;
  Measurement *this_local;
  
  z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (DenseIndex)S;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_48,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->measurements_,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z_pred);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  local_88 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  local_a0[0] = (MatrixTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
            (&local_80,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_88,
             (MatrixBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_a0);
  Eigen::
  MatrixBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>>>,4>>
  ::operator*(local_50,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80);
  SVar2 = Eigen::GeneralProduct::operator_cast_to_double((GeneralProduct *)local_50);
  this->nis_ = SVar2;
  Eigen::
  GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>
  ::~GeneralProduct(&local_80);
  dVar1 = this->nis_;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return dVar1;
}

Assistant:

double Measurement::NIS(const VectorXd &z_pred, const MatrixXd &S) {

  // TODO check dimensions
  VectorXd z_diff = measurements_ - z_pred;
  nis_ = z_diff.transpose() * S.inverse() * z_diff;
  return nis_;
}